

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom2gsf.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  size_t sVar6;
  mapped_type *pmVar7;
  char *pcVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  bool bVar12;
  char *endptr;
  char gsf_path [4096];
  char libname [4096];
  long local_20b8;
  uint32_t local_20b0;
  char *local_20a8;
  key_type local_20a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2080;
  char *local_2050;
  ulong local_2048;
  char **local_2040;
  char local_2038 [4];
  undefined1 auStack_2034 [4];
  undefined1 auStack_2030 [4088];
  char local_1038 [4104];
  
  if (argc == 1) {
LAB_00104843:
    usage(*argv);
  }
  else {
    local_2050 = (char *)0x0;
    local_20b8 = 0;
    memset(local_2038,0,0x1000);
    memset(local_1038,0,0x1000);
    if (argc < 2) {
      local_20b8._0_4_ = 0x8000000;
      iVar9 = 1;
      local_20a8 = (char *)0x0;
      local_20b0 = 0x8000000;
    }
    else {
      iVar9 = 1;
      bVar12 = true;
      bVar2 = false;
      local_20a8 = (char *)0x0;
      do {
        pcVar8 = argv[iVar9];
        if (*pcVar8 != '-') break;
        iVar3 = strcmp(pcVar8,"--help");
        if (iVar3 == 0) goto LAB_00104843;
        if ((pcVar8[1] != 'm') || (pcVar8[2] != '\0')) {
          if ((pcVar8[1] == 'o') && (pcVar8[2] == '\0')) {
            if (iVar9 + 1 < argc) {
              pcVar5 = argv[iVar9 + 1];
              pcVar8 = local_2038;
LAB_00104a2a:
              iVar9 = iVar9 + 1;
              strcpy(pcVar8,pcVar5);
              goto LAB_00104a2f;
            }
          }
          else {
            iVar3 = strcmp(pcVar8,"--load");
            if (iVar3 == 0) {
              iVar9 = iVar9 + 1;
              if (iVar9 < argc) {
                local_20b8 = strtol(argv[iVar9],&local_2050,0x10);
                if (((*local_2050 != '\0') || (piVar4 = __errno_location(), *piVar4 == 0x22)) ||
                   (local_20b8 < 0)) {
                  pcVar8 = argv[iVar9];
                  pcVar5 = "Error: Number format error \"%s\"\n";
                  goto LAB_00104d78;
                }
                if (((uint)local_20b8 & 0xfffc0000) != 0x2000000 &&
                    ((uint)local_20b8 & 0xfe000000) != 0x8000000) {
                  main_cold_1();
                  return 1;
                }
                bVar12 = false;
                goto LAB_00104a2f;
              }
            }
            else {
              iVar3 = strcmp(pcVar8,"--lib");
              if (iVar3 == 0) {
                if (iVar9 + 1 < argc) {
                  pcVar5 = argv[iVar9 + 1];
                  pcVar8 = local_1038;
                  goto LAB_00104a2a;
                }
              }
              else {
                iVar3 = strcmp(pcVar8,"--psfby");
                if ((iVar3 != 0) && (iVar3 = strcmp(pcVar8,"--gsfby"), iVar3 != 0)) {
                  pcVar5 = "Error: Unknown option \"%s\"\n";
                  goto LAB_00104d78;
                }
                iVar9 = iVar9 + 1;
                if (iVar9 < argc) {
                  local_20a8 = argv[iVar9];
                  goto LAB_00104a2f;
                }
              }
            }
          }
          pcVar5 = "Error: Too few arguments for \"%s\"\n";
LAB_00104d78:
          fprintf(_stderr,pcVar5,pcVar8);
          return 1;
        }
        bVar2 = true;
LAB_00104a2f:
        iVar9 = iVar9 + 1;
      } while (iVar9 < argc);
      local_20b0 = 0x8000000;
      if (bVar2) {
        local_20b0 = 0x2000000;
      }
      if (bVar12) {
        local_20b8._0_4_ = local_20b0;
      }
    }
    if (argc == iVar9) {
      main_cold_3();
    }
    else {
      if ((argc - iVar9 < 2) || (local_2038[0] == '\0')) {
        local_2048 = (ulong)(uint)(argc - iVar9);
        if (argc - iVar9 != 0 && iVar9 <= argc) {
          local_2040 = argv + iVar9;
          lVar11 = 0;
          uVar10 = 0;
          do {
            pcVar8 = local_2040[lVar11];
            if (local_2038[0] == '\0') {
              strcpy(local_2038,pcVar8);
              pcVar5 = path_findext(local_2038);
              cVar1 = local_1038[0];
              if (pcVar5 != (char *)0x0) {
                *pcVar5 = '\0';
              }
              sVar6 = strlen(local_2038);
              if (cVar1 != '\0') {
                builtin_strncpy(local_2038 + sVar6,".minigsf",8);
                auStack_2030[sVar6] = 0;
                goto LAB_00104b92;
              }
              auStack_2034[sVar6] = 0;
              builtin_strncpy(local_2038 + sVar6,".gsf",4);
              local_2080._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_2080._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_2080._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_2080._M_impl.super__Rb_tree_header._M_header;
              local_2080._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_2080._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_2080._M_impl.super__Rb_tree_header._M_header._M_left;
            }
            else {
              local_2080._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
              local_2080._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
              local_2080._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_2080._M_impl.super__Rb_tree_header._M_header;
              local_2080._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_2080._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_2080._M_impl.super__Rb_tree_header._M_header._M_left;
              if (local_1038[0] != '\0') {
LAB_00104b92:
                local_2080._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_2080._M_impl.super__Rb_tree_header._M_header;
                local_2080._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_2080._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
                local_2080._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                local_20a0._M_dataplus._M_p = (pointer)&local_20a0.field_2;
                local_2080._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_2080._M_impl.super__Rb_tree_header._M_header._M_left;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_20a0,"_lib","");
                pmVar7 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&local_2080,&local_20a0);
                pcVar5 = (char *)pmVar7->_M_string_length;
                strlen(local_1038);
                std::__cxx11::string::_M_replace((ulong)pmVar7,0,pcVar5,(ulong)local_1038);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_20a0._M_dataplus._M_p != &local_20a0.field_2) {
                  operator_delete(local_20a0._M_dataplus._M_p,
                                  local_20a0.field_2._M_allocated_capacity + 1);
                }
              }
            }
            if ((local_20a8 != (char *)0x0) && (*local_20a8 != '\0')) {
              local_20a0._M_dataplus._M_p = (pointer)&local_20a0.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_20a0,"gsfby","");
              pmVar7 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&local_2080,&local_20a0);
              pcVar5 = (char *)pmVar7->_M_string_length;
              strlen(local_20a8);
              std::__cxx11::string::_M_replace((ulong)pmVar7,0,pcVar5,(ulong)local_20a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_20a0._M_dataplus._M_p != &local_20a0.field_2) {
                operator_delete(local_20a0._M_dataplus._M_p,
                                local_20a0.field_2._M_allocated_capacity + 1);
              }
            }
            bVar2 = rom2gsf(pcVar8,local_2038,local_20b0,(uint32_t)local_20b8,
                            (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&local_2080);
            uVar10 = uVar10 + !bVar2;
            puts(local_2038);
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~_Rb_tree(&local_2080);
            lVar11 = lVar11 + 1;
          } while ((int)local_2048 != (int)lVar11);
          if (uVar10 != 0) {
            fprintf(_stderr,"%d error(s)\n",(ulong)uVar10);
            return 1;
          }
        }
        return 0;
      }
      main_cold_2();
    }
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
	if (argc == 1) {
		usage(argv[0]);
		return EXIT_FAILURE;
	}

	long longval;
	char *endptr = NULL;

	bool multiboot = false;
	uint32_t load_offset = 0;
	bool default_load_offset = true;
	char gsf_path[PATH_MAX] = { '\0' };
	char libname[PATH_MAX] = { '\0' };

	char *psfby = NULL;

	int argi = 1;
	while (argi < argc && argv[argi][0] == '-') {
		if (strcmp(argv[argi], "--help") == 0) {
			usage(argv[0]);
			return EXIT_FAILURE;
		}
		else if (strcmp(argv[argi], "-m") == 0) {
			multiboot = true;
		}
		else if (strcmp(argv[argi], "-o") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			strcpy(gsf_path, argv[argi + 1]);

			argi++;
		}
		else if (strcmp(argv[argi], "--load") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			longval = strtol(argv[argi + 1], &endptr, 16);
			if (*endptr != '\0' || errno == ERANGE || longval < 0)
			{
				fprintf(stderr, "Error: Number format error \"%s\"\n", argv[argi + 1]);
				return EXIT_FAILURE;
			}
			load_offset = longval;
			default_load_offset = false;

			if (!((load_offset >= 0x8000000 && load_offset <= 0x9ffffff) || (load_offset >= 0x2000000 && load_offset <= 0x203ffff))) {
				fprintf(stderr, "Error: Load offset 0x%08X is out of range\n", load_offset);
				fprintf(stderr, "       Valid ranges are 0x8000000..0x9FFFFFF and 0x2000000..0x203FFFF (for multiboot ROM)\n");
				return EXIT_FAILURE;
			}

			argi++;
		}
		else if (strcmp(argv[argi], "--lib") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			strcpy(libname, argv[argi + 1]);

			argi++;
		}
		else if (strcmp(argv[argi], "--psfby") == 0 || strcmp(argv[argi], "--gsfby") == 0) {
			if (argi + 1 >= argc) {
				fprintf(stderr, "Error: Too few arguments for \"%s\"\n", argv[argi]);
				return EXIT_FAILURE;
			}

			psfby = argv[argi + 1];

			argi++;
		}
		else {
			fprintf(stderr, "Error: Unknown option \"%s\"\n", argv[argi]);
			return EXIT_FAILURE;
		}
		argi++;
	}

	uint32_t gsf_entrypoint = multiboot ? 0x02000000 : 0x08000000;
	if (default_load_offset) {
		load_offset = multiboot ? 0x02000000 : 0x08000000;
	}

	int argnum = argc - argi;
	if (argnum == 0) {
		fprintf(stderr, "Error: No input files\n");
		return EXIT_FAILURE;
	}
	if (argnum > 1 && strcmp(gsf_path, "") != 0) {
		fprintf(stderr, "Error: Unable to specify output filename for multiple inputs\n");
		return EXIT_FAILURE;
	}

	int num_error = 0;
	for (; argi < argc; argi++) {
		const char * rom_path = argv[argi];
		const char * rom_ext = path_findext(rom_path);

		if (strcmp(gsf_path, "") == 0) {
			strcpy(gsf_path, rom_path);
			path_stripext(gsf_path);
			if (strcmp(libname, "") != 0) {
				strcat(gsf_path, ".minigsf");
			}
			else {
				strcat(gsf_path, ".gsf");
			}
		}

		std::map<std::string, std::string> tags;
		if (strcmp(libname, "") != 0) {
			tags["_lib"] = libname;
		}

		if (psfby != NULL && strcmp(psfby, "") != 0) {
			tags["gsfby"] = psfby;
		}

		if (!rom2gsf(rom_path, gsf_path, gsf_entrypoint, load_offset, tags)) {
			num_error++;
		}

		puts(gsf_path);
	}

	if (num_error != 0) {
		fprintf(stderr, "%d error(s)\n", num_error);
	}

	return (num_error == 0) ? EXIT_SUCCESS : EXIT_FAILURE;
}